

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getUntil(Nibbler *this,char c,string *result)

{
  string local_70 [32];
  string local_50 [32];
  size_type local_30;
  size_type i;
  string *result_local;
  Nibbler *pNStack_18;
  char c_local;
  Nibbler *this_local;
  
  if (this->_cursor < this->_length) {
    i = (size_type)result;
    result_local._7_1_ = c;
    pNStack_18 = this;
    local_30 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)c);
    if (local_30 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)this);
      std::__cxx11::string::operator=((string *)i,local_70);
      std::__cxx11::string::~string(local_70);
      this->_cursor = this->_length;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)i,local_50);
      std::__cxx11::string::~string(local_50);
      this->_cursor = local_30;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Nibbler::getUntil (char c, std::string& result)
{
  if (_cursor < _length)
  {
    std::string::size_type i = _input.find (c, _cursor);
    if (i != std::string::npos)
    {
      result = _input.substr (_cursor, i - _cursor);
      _cursor = i;
    }
    else
    {
      result = _input.substr (_cursor);
      _cursor = _length;
    }

    return true;
  }

  return false;
}